

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LegalizeJSInterface.cpp
# Opt level: O0

Function * __thiscall
wasm::LegalizeJSInterface::tempSetter(LegalizeJSInterface *this,Module *module)

{
  Name name;
  Function *pFVar1;
  Type in_R9;
  Name name_00;
  Type local_60;
  Type local_58;
  Module *local_50;
  size_t local_48;
  size_t local_40;
  char *local_38;
  size_t local_30;
  char *local_28;
  Export *local_20;
  Export *ex;
  Module *module_local;
  LegalizeJSInterface *this_local;
  
  if (this->setTempRet0 == (Function *)0x0) {
    ex = (Export *)module;
    module_local = (Module *)this;
    if ((this->exportedHelpers & 1U) == 0) {
      local_50 = SET_TEMP_RET_IMPORT;
      local_48 = DAT_027e54d8;
      wasm::Type::Type(&local_58,i32);
      wasm::Type::Type(&local_60,none);
      name_00.super_IString.str._M_str = (char *)local_58.id;
      name_00.super_IString.str._M_len = local_48;
      pFVar1 = getFunctionOrImport((LegalizeJSInterface *)module,local_50,name_00,local_60,in_R9);
      this->setTempRet0 = pFVar1;
    }
    else {
      local_30 = SET_TEMP_RET_EXPORT;
      local_28 = DAT_027e54b8;
      name.super_IString.str._M_str = DAT_027e54b8;
      name.super_IString.str._M_len = SET_TEMP_RET_EXPORT;
      local_20 = Module::getExport(module,name);
      local_40 = (local_20->value).super_IString.str._M_len;
      local_38 = (local_20->value).super_IString.str._M_str;
      pFVar1 = Module::getFunction((Module *)ex,(Name)(local_20->value).super_IString.str);
      this->setTempRet0 = pFVar1;
    }
  }
  return this->setTempRet0;
}

Assistant:

Function* tempSetter(Module* module) {
    if (!setTempRet0) {
      if (exportedHelpers) {
        auto* ex = module->getExport(SET_TEMP_RET_EXPORT);
        setTempRet0 = module->getFunction(ex->value);
      } else {
        setTempRet0 = getFunctionOrImport(
          module, SET_TEMP_RET_IMPORT, Type::i32, Type::none);
      }
    }
    return setTempRet0;
  }